

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstate.cpp
# Opt level: O3

ChainstateLoadResult *
node::CompleteChainstateInitialization
          (ChainstateLoadResult *__return_storage_ptr__,ChainstateManager *chainman,
          CacheSizes *cache_sizes,ChainstateLoadOptions *options)

{
  unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *this;
  bool should_wipe;
  CoinsViews *pCVar1;
  pointer ppCVar2;
  double dVar3;
  path leveldb_name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  CDBWrapper *this_00;
  CBlockIndex *pCVar6;
  Chainstate *pCVar7;
  unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *puVar8;
  CCoinsViewCache *pCVar9;
  uchar *puVar10;
  pointer __p;
  ulong uVar11;
  _Alloc_hider _Var12;
  long lVar13;
  long lVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> chainstates;
  bilingual_str *__return_storage_ptr___00;
  char *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  ChainstateManager *pCVar17;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> __x;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> local_168;
  _Any_data local_150;
  code *local_140;
  bilingual_str local_130;
  path local_f0;
  bilingual_str local_c8;
  path local_88;
  path local_60;
  ChainstateLoadResult *local_38;
  
  local_38 = *(ChainstateLoadResult **)(in_FS_OFFSET + 0x28);
  this = &(chainman->m_blockman).m_block_tree_db;
  std::__uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::reset
            ((__uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)this
             ,(pointer)0x0);
  std::filesystem::__cxx11::path::path(&local_88,&(chainman->m_options).datadir.super_path);
  std::filesystem::__cxx11::path::_M_append(&local_88,6,"blocks");
  std::filesystem::__cxx11::path::path(&local_60,&local_88);
  std::filesystem::__cxx11::path::_M_append(&local_60,5,"index");
  std::filesystem::__cxx11::path::path((path *)&local_c8,&local_60);
  local_c8.translated._M_string_length = cache_sizes->block_tree_db;
  local_c8.translated.field_2._M_local_buf[0] = options->block_tree_db_in_memory;
  local_c8.translated.field_2._M_local_buf[1] = options->wipe_block_tree_db;
  local_c8.translated.field_2._M_local_buf[2] = '\0';
  local_c8.translated.field_2._M_local_buf[3] = (chainman->m_options).block_tree_db.force_compact;
  this_00 = (CDBWrapper *)operator_new(0x70);
  CDBWrapper::CDBWrapper(this_00,(DBParams *)&local_c8);
  local_130.original._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::reset
            ((__uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)this
             ,(pointer)this_00);
  std::unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::~unique_ptr
            ((unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)
             &local_130);
  std::filesystem::__cxx11::path::~path((path *)&local_c8);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::filesystem::__cxx11::path::~path(&local_88);
  if (options->wipe_block_tree_db == true) {
    kernel::BlockTreeDB::WriteReindexing
              ((chainman->m_blockman).m_block_tree_db._M_t.
               super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
               ._M_t.
               super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
               .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl,true);
    LOCK();
    (chainman->m_blockman).m_blockfiles_indexed._M_base._M_i = false;
    UNLOCK();
    if (options->prune == true) {
      BlockManager::CleanupBlockRevFiles(&chainman->m_blockman);
    }
  }
  bVar5 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt);
  if (bVar5) {
    local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
    local_c8.original._M_string_length = 0;
    local_c8.original.field_2._M_local_buf[0] = '\0';
    local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
    local_c8.translated._M_string_length = 0;
    local_c8.translated.field_2._M_local_buf[0] = '\0';
    std::_Head_base<1UL,_bilingual_str,_false>::_Head_base
              ((_Head_base<1UL,_bilingual_str,_false> *)__return_storage_ptr__,&local_c8);
LAB_00223300:
    *(ChainstateLoadStatus *)
     &(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)__return_storage_ptr__ + 0x40))->_M_dataplus)._M_p = INTERRUPTED;
LAB_00223309:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.translated._M_dataplus._M_p != &local_c8.translated.field_2) {
      operator_delete(local_c8.translated._M_dataplus._M_p,
                      CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                        CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                                 CONCAT11(local_c8.translated.field_2._M_local_buf
                                                          [1],local_c8.translated.field_2.
                                                              _M_local_buf[0])))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.original._M_dataplus._M_p == &local_c8.original.field_2) goto LAB_00223bc2;
    uVar11 = CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                      local_c8.original.field_2._M_local_buf[0]) + 1;
    _Var12._M_p = local_c8.original._M_dataplus._M_p;
  }
  else {
    pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __return_storage_ptr__;
    bVar5 = ChainstateManager::LoadBlockIndex(chainman);
    if (!bVar5) {
      bVar5 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt);
      if (!bVar5) {
        paVar15 = &local_c8.original.field_2;
        local_c8.original._M_dataplus._M_p = (pointer)paVar15;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"Error loading block database","");
        paVar4 = &local_c8.translated.field_2;
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_c8.translated._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8.translated,"Error loading block database","");
        }
        else {
          local_130.original._M_dataplus._M_p = "Error loading block database";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&local_c8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                     (char **)&local_130);
        }
        (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
         &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __return_storage_ptr__)->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
        super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
             (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__)->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.original._M_dataplus._M_p == paVar15) {
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __return_storage_ptr__)->field_2)._M_allocated_capacity =
               CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                        local_c8.original.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__)->field_2 + 8) = local_c8.original.field_2._8_8_;
        }
        else {
          (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
           &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __return_storage_ptr__)->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
          super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
               local_c8.original._M_dataplus._M_p;
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __return_storage_ptr__)->field_2)._M_allocated_capacity =
               CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                        local_c8.original.field_2._M_local_buf[0]);
        }
        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__return_storage_ptr__
        )->_M_string_length = local_c8.original._M_string_length;
        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
             (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)__return_storage_ptr__ + 0x20))->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.translated._M_dataplus._M_p == paVar4) {
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
               CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                        CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                 CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                          CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                   local_c8.translated.field_2._M_local_buf[0]))));
          *(undefined8 *)
           ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)__return_storage_ptr__ + 0x20))->field_2 + 8) =
               local_c8.translated.field_2._8_8_;
        }
        else {
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
               local_c8.translated._M_dataplus._M_p;
LAB_00223b9f:
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
               CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                        CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                 CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                          CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                   local_c8.translated.field_2._M_local_buf[0]))));
        }
LAB_00223bac:
        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        ((long)__return_storage_ptr__ + 0x20))->_M_string_length =
             local_c8.translated._M_string_length;
        *(ChainstateLoadStatus *)
         &(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)__return_storage_ptr__ + 0x40))->_M_dataplus)._M_p = FAILURE;
        goto LAB_00223bc2;
      }
      local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
      local_c8.original._M_string_length = 0;
      local_c8.original.field_2._M_local_buf[0] = '\0';
      local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
      local_c8.translated._M_string_length = 0;
      local_c8.translated.field_2._M_local_buf[0] = '\0';
      std::_Head_base<1UL,_bilingual_str,_false>::_Head_base
                ((_Head_base<1UL,_bilingual_str,_false> *)__return_storage_ptr__,&local_c8);
      goto LAB_00223300;
    }
    if (((chainman->m_blockman).m_block_index._M_h._M_element_count != 0) &&
       (pCVar6 = BlockManager::LookupBlockIndex
                           (&chainman->m_blockman,(uint256 *)(chainman->m_options).chainparams),
       pCVar6 == (CBlockIndex *)0x0)) {
      paVar15 = &local_c8.original.field_2;
      local_c8.original._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,
                 "Incorrect or no genesis block found. Wrong datadir for network?","");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8.translated,
                   "Incorrect or no genesis block found. Wrong datadir for network?","");
      }
      else {
        local_130.original._M_dataplus._M_p =
             "Incorrect or no genesis block found. Wrong datadir for network?";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_c8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                   (char **)&local_130);
      }
      (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
       &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__return_storage_ptr__
        )->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
      super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
           (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__)->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.original._M_dataplus._M_p == paVar15) {
        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __return_storage_ptr__)->field_2)._M_allocated_capacity =
             CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                      local_c8.original.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__)->field_2 + 8) = local_c8.original.field_2._8_8_;
      }
      else {
        (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
         &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __return_storage_ptr__)->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
        super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
             local_c8.original._M_dataplus._M_p;
        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __return_storage_ptr__)->field_2)._M_allocated_capacity =
             CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                      local_c8.original.field_2._M_local_buf[0]);
      }
      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__return_storage_ptr__)
      ->_M_string_length = local_c8.original._M_string_length;
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
           (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)__return_storage_ptr__ + 0x20))->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.translated._M_dataplus._M_p == &local_c8.translated.field_2) {
        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
             CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                      CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                               CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                        CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                 local_c8.translated.field_2._M_local_buf[0]))));
        *(undefined8 *)
         ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)__return_storage_ptr__ + 0x20))->field_2 + 8) =
             local_c8.translated.field_2._8_8_;
      }
      else {
        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
             local_c8.translated._M_dataplus._M_p;
        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
             CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                      CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                               CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                        CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                 local_c8.translated.field_2._M_local_buf[0]))));
      }
      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      ((long)__return_storage_ptr__ + 0x20))->_M_string_length =
           local_c8.translated._M_string_length;
      *(ChainstateLoadStatus *)
       &(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)__return_storage_ptr__ + 0x40))->_M_dataplus)._M_p = FAILURE_INCOMPATIBLE_DB;
      goto LAB_00223bc2;
    }
    if (((chainman->m_blockman).m_have_pruned == true) && (options->prune == false)) {
      local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,
                 "You need to rebuild the database using -reindex to go back to unpruned mode.  This will redownload the entire blockchain"
                 ,"");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8.translated,
                   "You need to rebuild the database using -reindex to go back to unpruned mode.  This will redownload the entire blockchain"
                   ,"");
      }
      else {
        local_130.original._M_dataplus._M_p =
             "You need to rebuild the database using -reindex to go back to unpruned mode.  This will redownload the entire blockchain"
        ;
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_c8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                   (char **)&local_130);
      }
LAB_00223b44:
      (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
       &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__return_storage_ptr__
        )->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
      super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
           (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__)->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.original._M_dataplus._M_p == &local_c8.original.field_2) {
        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __return_storage_ptr__)->field_2)._M_allocated_capacity =
             CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                      local_c8.original.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__)->field_2 + 8) = local_c8.original.field_2._8_8_;
      }
      else {
        (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
         &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __return_storage_ptr__)->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
        super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
             local_c8.original._M_dataplus._M_p;
        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __return_storage_ptr__)->field_2)._M_allocated_capacity =
             CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                      local_c8.original.field_2._M_local_buf[0]);
      }
      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__return_storage_ptr__)
      ->_M_string_length = local_c8.original._M_string_length;
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
           (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)__return_storage_ptr__ + 0x20))->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.translated._M_dataplus._M_p != &local_c8.translated.field_2) {
        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
             local_c8.translated._M_dataplus._M_p;
        goto LAB_00223b9f;
      }
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
           CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                    CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                             CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                      CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                               local_c8.translated.field_2._M_local_buf[0]))));
      *(undefined8 *)
       ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)__return_storage_ptr__ + 0x20))->field_2 + 8) =
           local_c8.translated.field_2._8_8_;
      goto LAB_00223bac;
    }
    if (((chainman->m_blockman).m_blockfiles_indexed._M_base._M_i & 1U) != 0) {
      pCVar7 = ChainstateManager::ActiveChainstate(chainman);
      bVar5 = Chainstate::LoadGenesisBlock(pCVar7);
      if (!bVar5) {
        local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"Error initializing block database","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8.translated,"Error initializing block database","");
        }
        else {
          local_130.original._M_dataplus._M_p = "Error initializing block database";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&local_c8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                     (char **)&local_130);
        }
        goto LAB_00223b44;
      }
    }
    if (chainman->m_total_coinstip_cache < 1) {
      __assert_fail("chainman.m_total_coinstip_cache > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
                    ,0x5f,
                    "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                   );
    }
    if (chainman->m_total_coinsdb_cache < 1) {
      __assert_fail("chainman.m_total_coinsdb_cache > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
                    ,0x60,
                    "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                   );
    }
    ChainstateManager::GetAll
              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_130,chainman);
    if (local_130.original._M_dataplus._M_p != (pointer)local_130.original._M_string_length) {
      __x._M_head_impl = (_Impl *)&options->coins_error_cb;
      _Var12._M_p = local_130.original._M_dataplus._M_p;
      __return_storage_ptr__ = (ChainstateLoadResult *)pbVar16;
      do {
        pCVar7 = *(Chainstate **)_Var12._M_p;
        __return_storage_ptr___00 = &local_c8;
        pCVar17 = chainman;
        Chainstate::ToString_abi_cxx11_(&__return_storage_ptr___00->original,pCVar7);
        logging_function._M_str = "CompleteChainstateInitialization";
        logging_function._M_len = 0x20;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
        ;
        source_file._M_len = 0x5c;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function,source_file,0x6c,
                   IPC|RAND|CMPCTBLOCK|SELECTCOINS|ESTIMATEFEE|RPC|WALLETDB|TOR,
                   (Level)__return_storage_ptr___00,in_stack_fffffffffffffe70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.original._M_dataplus._M_p != &local_c8.original.field_2) {
          operator_delete(local_c8.original._M_dataplus._M_p,
                          CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                                   local_c8.original.field_2._M_local_buf[0]) + 1);
        }
        lVar13 = chainman->m_total_coinsdb_cache;
        bVar5 = options->coins_db_in_memory;
        should_wipe = options->wipe_chainstate_db;
        local_c8.original._M_dataplus._M_p = "chainstate";
        std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                  (&local_f0,(char **)&local_c8,auto_format);
        dVar3 = (double)lVar13 * 0.2;
        uVar11 = (ulong)dVar3;
        leveldb_name.super_path._M_pathname._M_string_length = (size_type)in_stack_fffffffffffffe70;
        leveldb_name.super_path._M_pathname._M_dataplus._M_p = (pointer)__return_storage_ptr___00;
        leveldb_name.super_path._M_pathname.field_2._M_allocated_capacity =
             (size_type)__return_storage_ptr__;
        leveldb_name.super_path._M_pathname.field_2._8_8_ = pCVar17;
        leveldb_name.super_path._M_cmpts._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
             (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                )__x._M_head_impl;
        Chainstate::InitCoinsDB
                  (pCVar7,(long)(dVar3 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11,
                   bVar5,should_wipe,leveldb_name);
        std::filesystem::__cxx11::path::~path(&local_f0);
        chainman = pCVar17;
        if ((options->coins_error_cb).super__Function_base._M_manager != (_Manager_type)0x0) {
          puVar8 = inline_assertion_check<true,std::unique_ptr<CoinsViews,std::default_delete<CoinsViews>>&>
                             (&pCVar7->m_coins_views,
                              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.h"
                              ,0x285,"CoinsErrorCatcher","m_coins_views");
          pCVar1 = (puVar8->_M_t).
                   super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
                   super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
                   super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
          std::function<void_()>::function
                    ((function<void_()> *)&local_150,(function<void_()> *)__x._M_head_impl);
          std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
          emplace_back<std::function<void()>>
                    ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)
                     &(pCVar1->m_catcherview).m_err_callbacks,(function<void_()> *)&local_150);
          chainman = pCVar17;
          if (local_140 != (code *)0x0) {
            (*local_140)(&local_150,&local_150,__destroy_functor);
            chainman = pCVar17;
          }
        }
        puVar8 = inline_assertion_check<true,std::unique_ptr<CoinsViews,std::default_delete<CoinsViews>>&>
                           (&pCVar7->m_coins_views,
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.h"
                            ,0x277,"CoinsDB","m_coins_views");
        bVar5 = CCoinsViewDB::NeedsUpgrade
                          (&((puVar8->_M_t).
                             super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
                             super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl)->m_dbview);
        if (bVar5) {
          paVar15 = &local_c8.original.field_2;
          local_c8.original._M_dataplus._M_p = (pointer)paVar15;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,
                     "Unsupported chainstate database format found. Please restart with -reindex-chainstate. This will rebuild the chainstate database."
                     ,"");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8.translated,
                       "Unsupported chainstate database format found. Please restart with -reindex-chainstate. This will rebuild the chainstate database."
                       ,"");
          }
          else {
            local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x8035de;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      (&local_c8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                       (char **)&local_168);
          }
          (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
           &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __return_storage_ptr__)->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
          super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
               (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__)->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.original._M_dataplus._M_p == paVar15) {
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__)->field_2)._M_allocated_capacity =
                 CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                          local_c8.original.field_2._M_local_buf[0]);
            *(undefined8 *)
             ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__)->field_2 + 8) = local_c8.original.field_2._8_8_;
          }
          else {
            (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
             &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __return_storage_ptr__)->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
            super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
                 local_c8.original._M_dataplus._M_p;
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__)->field_2)._M_allocated_capacity =
                 CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                          local_c8.original.field_2._M_local_buf[0]);
          }
          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __return_storage_ptr__)->_M_string_length = local_c8.original._M_string_length;
          local_c8.original._M_string_length = 0;
          local_c8.original.field_2._M_local_buf[0] = '\0';
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
               (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)__return_storage_ptr__ + 0x20))->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.translated._M_dataplus._M_p == &local_c8.translated.field_2) {
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
                 CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                          CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                   CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                            CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                     local_c8.translated.field_2._M_local_buf[0]))))
            ;
            *(undefined8 *)
             ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)__return_storage_ptr__ + 0x20))->field_2 + 8) =
                 local_c8.translated.field_2._8_8_;
          }
          else {
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
                 local_c8.translated._M_dataplus._M_p;
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
                 CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                          CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                   CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                            CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                     local_c8.translated.field_2._M_local_buf[0]))))
            ;
          }
          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)__return_storage_ptr__ + 0x20))->_M_string_length =
               local_c8.translated._M_string_length;
          *(ChainstateLoadStatus *)
           &(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)__return_storage_ptr__ + 0x40))->_M_dataplus)._M_p = FAILURE_INCOMPATIBLE_DB;
          local_c8.original._M_dataplus._M_p = (pointer)paVar15;
LAB_00223fd2:
          _Var12._M_p = local_130.original._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130.original._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) goto LAB_00223fe5;
          goto LAB_00223bc2;
        }
        bVar5 = Chainstate::ReplayBlocks(pCVar7);
        if (!bVar5) {
          paVar15 = &local_c8.original.field_2;
          local_c8.original._M_dataplus._M_p = (pointer)paVar15;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,
                     "Unable to replay blocks. You will need to rebuild the database using -reindex-chainstate."
                     ,"");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8.translated,
                       "Unable to replay blocks. You will need to rebuild the database using -reindex-chainstate."
                       ,"");
          }
          else {
            local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x803660;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      (&local_c8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                       (char **)&local_168);
          }
          (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
           &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __return_storage_ptr__)->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
          super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
               (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__)->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.original._M_dataplus._M_p == paVar15) {
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__)->field_2)._M_allocated_capacity =
                 CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                          local_c8.original.field_2._M_local_buf[0]);
            *(undefined8 *)
             ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__)->field_2 + 8) = local_c8.original.field_2._8_8_;
          }
          else {
            (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
             &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __return_storage_ptr__)->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
            super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
                 local_c8.original._M_dataplus._M_p;
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__)->field_2)._M_allocated_capacity =
                 CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                          local_c8.original.field_2._M_local_buf[0]);
          }
          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __return_storage_ptr__)->_M_string_length = local_c8.original._M_string_length;
          local_c8.original._M_string_length = 0;
          local_c8.original.field_2._M_local_buf[0] = '\0';
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
               (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)__return_storage_ptr__ + 0x20))->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.translated._M_dataplus._M_p == &local_c8.translated.field_2) {
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
                 CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                          CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                   CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                            CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                     local_c8.translated.field_2._M_local_buf[0]))))
            ;
            *(undefined8 *)
             ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)__return_storage_ptr__ + 0x20))->field_2 + 8) =
                 local_c8.translated.field_2._8_8_;
          }
          else {
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
                 local_c8.translated._M_dataplus._M_p;
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
                 CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                          CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                   CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                            CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                     local_c8.translated.field_2._M_local_buf[0]))))
            ;
          }
          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)__return_storage_ptr__ + 0x20))->_M_string_length =
               local_c8.translated._M_string_length;
          *(ChainstateLoadStatus *)
           &(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)__return_storage_ptr__ + 0x40))->_M_dataplus)._M_p = FAILURE;
          local_c8.original._M_dataplus._M_p = (pointer)paVar15;
          goto LAB_00223fd2;
        }
        dVar3 = (double)chainman->m_total_coinstip_cache * 0.2;
        uVar11 = (ulong)dVar3;
        Chainstate::InitCoinsCache
                  (pCVar7,(long)(dVar3 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11);
        pCVar1 = (pCVar7->m_coins_views)._M_t.
                 super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
                 super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
                 super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
        if ((pCVar1 == (CoinsViews *)0x0) ||
           ((_Head_base<0UL,_CCoinsViewCache_*,_false>)
            *(_Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_> *)
             &(pCVar1->m_cacheview)._M_t.
              super___uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_> ==
            (CCoinsViewCache *)0x0)) {
          __assert_fail("chainstate->CanFlushToDisk()",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
                        ,0x86,
                        "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                       );
        }
        if (options->wipe_chainstate_db != true) {
          pCVar9 = Chainstate::CoinsTip(pCVar7);
          (*(pCVar9->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(&local_c8,pCVar9)
          ;
          puVar10 = std::
                    __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                              (&local_c8,&local_c8.translated);
          if ((string *)puVar10 != &local_c8.translated) {
            bVar5 = Chainstate::LoadChainTip(pCVar7);
            if (!bVar5) {
              _(&local_c8,(ConstevalStringLiteral)0x8034b4);
              (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
               &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__)->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
              super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
                   (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __return_storage_ptr__)->field_2;
              paVar15 = &local_c8.original.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8.original._M_dataplus._M_p == paVar15) {
                (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__)->field_2)._M_allocated_capacity =
                     CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                              local_c8.original.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__)->field_2 + 8) = local_c8.original.field_2._8_8_;
              }
              else {
                (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
                 &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__)->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
                super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
                     local_c8.original._M_dataplus._M_p;
                (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__)->field_2)._M_allocated_capacity =
                     CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                              local_c8.original.field_2._M_local_buf[0]);
              }
              paVar4 = &local_c8.translated.field_2;
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __return_storage_ptr__)->_M_string_length = local_c8.original._M_string_length;
              local_c8.original._M_string_length = 0;
              local_c8.original.field_2._M_local_buf[0] = '\0';
              (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
                   (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)__return_storage_ptr__ + 0x20))->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8.translated._M_dataplus._M_p == paVar4) {
                (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
                     CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                              CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                       CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                                CONCAT11(local_c8.translated.field_2._M_local_buf[1]
                                                         ,local_c8.translated.field_2._M_local_buf
                                                          [0]))));
                *(undefined8 *)
                 ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)__return_storage_ptr__ + 0x20))->field_2 + 8) =
                     local_c8.translated.field_2._8_8_;
              }
              else {
                (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
                     local_c8.translated._M_dataplus._M_p;
                (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
                     CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                              CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                       CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                                CONCAT11(local_c8.translated.field_2._M_local_buf[1]
                                                         ,local_c8.translated.field_2._M_local_buf
                                                          [0]))));
              }
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)__return_storage_ptr__ + 0x20))->_M_string_length =
                   local_c8.translated._M_string_length;
              local_c8.translated._M_string_length = 0;
              local_c8.translated.field_2._M_local_buf[0] = '\0';
              *(ChainstateLoadStatus *)
               &(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)__return_storage_ptr__ + 0x40))->_M_dataplus)._M_p = FAILURE;
              local_c8.original._M_dataplus._M_p = (pointer)paVar15;
              local_c8.translated._M_dataplus._M_p = (pointer)paVar4;
              bilingual_str::~bilingual_str(&local_c8);
              goto LAB_00223fd2;
            }
            ppCVar2 = (pCVar7->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if ((ppCVar2 ==
                 (pCVar7->m_chain).vChain.
                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Vector_impl_data._M_start) || (ppCVar2[-1] == (CBlockIndex *)0x0)) {
              __assert_fail("chainstate->m_chain.Tip() != nullptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
                            ,0x8d,
                            "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                           );
            }
          }
        }
        _Var12._M_p = _Var12._M_p + 8;
        pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__;
      } while (_Var12._M_p != (pointer)local_130.original._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.original._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_130.original._M_dataplus._M_p,
                      local_130.original.field_2._M_allocated_capacity -
                      (long)local_130.original._M_dataplus._M_p);
    }
    if (options->wipe_block_tree_db != false) {
LAB_00223e5d:
      ChainstateManager::MaybeRebalanceCaches(chainman);
      local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
      local_c8.original._M_string_length = 0;
      local_c8.original.field_2._M_local_buf[0] = '\0';
      local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
      local_c8.translated._M_string_length = 0;
      local_c8.translated.field_2._M_local_buf[0] = '\0';
      std::_Head_base<1UL,_bilingual_str,_false>::_Head_base
                ((_Head_base<1UL,_bilingual_str,_false> *)__return_storage_ptr__,&local_c8);
      *(ChainstateLoadStatus *)
       &(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)__return_storage_ptr__ + 0x40))->_M_dataplus)._M_p = SUCCESS;
      goto LAB_00223309;
    }
    ChainstateManager::GetAll(&local_168,chainman);
    lVar13 = (long)local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    __return_storage_ptr__ = (ChainstateLoadResult *)pbVar16;
    if (0 < lVar13 >> 5) {
      lVar14 = (lVar13 >> 5) + 1;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
                   .super__Vector_impl_data._M_start + 2);
      do {
        paVar15 = paVar4;
        bVar5 = Chainstate::NeedsRedownload((Chainstate *)(&paVar15->_M_allocated_capacity)[-2]);
        if (bVar5) {
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar15->_M_allocated_capacity + -2);
          goto LAB_00223de5;
        }
        bVar5 = Chainstate::NeedsRedownload((Chainstate *)(&paVar15->_M_allocated_capacity)[-1]);
        if (bVar5) {
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar15->_M_allocated_capacity + -1);
          goto LAB_00223de5;
        }
        bVar5 = Chainstate::NeedsRedownload((Chainstate *)paVar15->_M_allocated_capacity);
        if (bVar5) goto LAB_00223de5;
        bVar5 = Chainstate::NeedsRedownload((Chainstate *)(&paVar15->_M_allocated_capacity)[1]);
        if (bVar5) {
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar15->_M_allocated_capacity + 1);
          goto LAB_00223de5;
        }
        lVar14 = lVar14 + -1;
        lVar13 = lVar13 + -0x20;
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar15->_M_allocated_capacity + 4);
      } while (1 < lVar14);
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar15->_M_allocated_capacity + 2);
    }
    lVar13 = lVar13 >> 3;
    if (lVar13 != 1) {
      if (lVar13 == 2) {
LAB_00223db5:
        bVar5 = Chainstate::NeedsRedownload((Chainstate *)paVar15->_M_allocated_capacity);
        if (!bVar5) {
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar15->_M_allocated_capacity + 1);
          goto LAB_00223dcc;
        }
        goto LAB_00223de5;
      }
      if (lVar13 == 3) {
        bVar5 = Chainstate::NeedsRedownload((Chainstate *)paVar15->_M_allocated_capacity);
        if (!bVar5) {
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar15->_M_allocated_capacity + 1);
          goto LAB_00223db5;
        }
        goto LAB_00223de5;
      }
LAB_00223e46:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
             super__Vector_impl_data._M_start !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_168.
                              super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.
                              super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_00223e5d;
    }
LAB_00223dcc:
    bVar5 = Chainstate::NeedsRedownload((Chainstate *)paVar15->_M_allocated_capacity);
    if (!bVar5) {
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
                   .super__Vector_impl_data._M_finish;
    }
LAB_00223de5:
    if (paVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
           super__Vector_impl_data._M_finish) goto LAB_00223e46;
    _(&local_130,(ConstevalStringLiteral)0x8036fc);
    tinyformat::format<int>
              (&local_c8,&local_130,&(((chainman->m_options).chainparams)->consensus).SegwitHeight);
    (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
     &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__return_storage_ptr__)
      ->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
    super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
         (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__)->field_2;
    paVar15 = &local_c8.original.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.original._M_dataplus._M_p == paVar15) {
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__return_storage_ptr__)
      ->field_2)._M_allocated_capacity =
           CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                    local_c8.original.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__)->field_2 + 8) = local_c8.original.field_2._8_8_;
    }
    else {
      (((_Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str> *)
       &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__return_storage_ptr__
        )->_M_dataplus)->super__Tuple_impl<1UL,_bilingual_str>).
      super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original._M_dataplus._M_p =
           local_c8.original._M_dataplus._M_p;
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__return_storage_ptr__)
      ->field_2)._M_allocated_capacity =
           CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                    local_c8.original.field_2._M_local_buf[0]);
    }
    paVar4 = &local_c8.translated.field_2;
    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__return_storage_ptr__)->
    _M_string_length = local_c8.original._M_string_length;
    local_c8.original._M_string_length = 0;
    local_c8.original.field_2._M_local_buf[0] = '\0';
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
     ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
         (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)__return_storage_ptr__ + 0x20))->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.translated._M_dataplus._M_p == paVar4) {
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
           CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                    CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                             CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                      CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                               local_c8.translated.field_2._M_local_buf[0]))));
      *(undefined8 *)
       ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)__return_storage_ptr__ + 0x20))->field_2 + 8) =
           local_c8.translated.field_2._8_8_;
    }
    else {
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p =
           local_c8.translated._M_dataplus._M_p;
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)__return_storage_ptr__ + 0x20))->field_2)._M_allocated_capacity =
           CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                    CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                             CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                      CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                               local_c8.translated.field_2._M_local_buf[0]))));
    }
    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
    ((long)__return_storage_ptr__ + 0x20))->_M_string_length = local_c8.translated._M_string_length;
    local_c8.translated._M_string_length = 0;
    local_c8.translated.field_2._M_local_buf[0] = '\0';
    *(ChainstateLoadStatus *)
     &(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)__return_storage_ptr__ + 0x40))->_M_dataplus)._M_p = FAILURE;
    local_c8.original._M_dataplus._M_p = (pointer)paVar15;
    local_c8.translated._M_dataplus._M_p = (pointer)paVar4;
    bilingual_str::~bilingual_str(&local_c8);
    bilingual_str::~bilingual_str(&local_130);
    local_130.original.field_2._M_allocated_capacity =
         (size_type)
         local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    _Var12._M_p = (pointer)local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
           super__Vector_impl_data._M_start ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_00223bc2;
LAB_00223fe5:
    uVar11 = local_130.original.field_2._M_allocated_capacity - (long)_Var12._M_p;
  }
  operator_delete(_Var12._M_p,uVar11);
LAB_00223bc2:
  if (*(ChainstateLoadResult **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(ChainstateLoadResult **)(in_FS_OFFSET + 0x28);
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
{
    auto& pblocktree{chainman.m_blockman.m_block_tree_db};
    // new BlockTreeDB tries to delete the existing file, which
    // fails if it's still open from the previous loop. Close it first:
    pblocktree.reset();
    pblocktree = std::make_unique<BlockTreeDB>(DBParams{
        .path = chainman.m_options.datadir / "blocks" / "index",
        .cache_bytes = static_cast<size_t>(cache_sizes.block_tree_db),
        .memory_only = options.block_tree_db_in_memory,
        .wipe_data = options.wipe_block_tree_db,
        .options = chainman.m_options.block_tree_db});

    if (options.wipe_block_tree_db) {
        pblocktree->WriteReindexing(true);
        chainman.m_blockman.m_blockfiles_indexed = false;
        //If we're reindexing in prune mode, wipe away unusable block files and all undo data files
        if (options.prune) {
            chainman.m_blockman.CleanupBlockRevFiles();
        }
    }

    if (chainman.m_interrupt) return {ChainstateLoadStatus::INTERRUPTED, {}};

    // LoadBlockIndex will load m_have_pruned if we've ever removed a
    // block file from disk.
    // Note that it also sets m_blockfiles_indexed based on the disk flag!
    if (!chainman.LoadBlockIndex()) {
        if (chainman.m_interrupt) return {ChainstateLoadStatus::INTERRUPTED, {}};
        return {ChainstateLoadStatus::FAILURE, _("Error loading block database")};
    }

    if (!chainman.BlockIndex().empty() &&
            !chainman.m_blockman.LookupBlockIndex(chainman.GetConsensus().hashGenesisBlock)) {
        // If the loaded chain has a wrong genesis, bail out immediately
        // (we're likely using a testnet datadir, or the other way around).
        return {ChainstateLoadStatus::FAILURE_INCOMPATIBLE_DB, _("Incorrect or no genesis block found. Wrong datadir for network?")};
    }

    // Check for changed -prune state.  What we are concerned about is a user who has pruned blocks
    // in the past, but is now trying to run unpruned.
    if (chainman.m_blockman.m_have_pruned && !options.prune) {
        return {ChainstateLoadStatus::FAILURE, _("You need to rebuild the database using -reindex to go back to unpruned mode.  This will redownload the entire blockchain")};
    }

    // At this point blocktree args are consistent with what's on disk.
    // If we're not mid-reindex (based on disk + args), add a genesis block on disk
    // (otherwise we use the one already on disk).
    // This is called again in ImportBlocks after the reindex completes.
    if (chainman.m_blockman.m_blockfiles_indexed && !chainman.ActiveChainstate().LoadGenesisBlock()) {
        return {ChainstateLoadStatus::FAILURE, _("Error initializing block database")};
    }

    auto is_coinsview_empty = [&](Chainstate* chainstate) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        return options.wipe_chainstate_db || chainstate->CoinsTip().GetBestBlock().IsNull();
    };

    assert(chainman.m_total_coinstip_cache > 0);
    assert(chainman.m_total_coinsdb_cache > 0);

    // Conservative value which is arbitrarily chosen, as it will ultimately be changed
    // by a call to `chainman.MaybeRebalanceCaches()`. We just need to make sure
    // that the sum of the two caches (40%) does not exceed the allowable amount
    // during this temporary initialization state.
    double init_cache_fraction = 0.2;

    // At this point we're either in reindex or we've loaded a useful
    // block tree into BlockIndex()!

    for (Chainstate* chainstate : chainman.GetAll()) {
        LogPrintf("Initializing chainstate %s\n", chainstate->ToString());

        chainstate->InitCoinsDB(
            /*cache_size_bytes=*/chainman.m_total_coinsdb_cache * init_cache_fraction,
            /*in_memory=*/options.coins_db_in_memory,
            /*should_wipe=*/options.wipe_chainstate_db);

        if (options.coins_error_cb) {
            chainstate->CoinsErrorCatcher().AddReadErrCallback(options.coins_error_cb);
        }

        // Refuse to load unsupported database format.
        // This is a no-op if we cleared the coinsviewdb with -reindex or -reindex-chainstate
        if (chainstate->CoinsDB().NeedsUpgrade()) {
            return {ChainstateLoadStatus::FAILURE_INCOMPATIBLE_DB, _("Unsupported chainstate database format found. "
                                                                     "Please restart with -reindex-chainstate. This will "
                                                                     "rebuild the chainstate database.")};
        }

        // ReplayBlocks is a no-op if we cleared the coinsviewdb with -reindex or -reindex-chainstate
        if (!chainstate->ReplayBlocks()) {
            return {ChainstateLoadStatus::FAILURE, _("Unable to replay blocks. You will need to rebuild the database using -reindex-chainstate.")};
        }

        // The on-disk coinsdb is now in a good state, create the cache
        chainstate->InitCoinsCache(chainman.m_total_coinstip_cache * init_cache_fraction);
        assert(chainstate->CanFlushToDisk());

        if (!is_coinsview_empty(chainstate)) {
            // LoadChainTip initializes the chain based on CoinsTip()'s best block
            if (!chainstate->LoadChainTip()) {
                return {ChainstateLoadStatus::FAILURE, _("Error initializing block database")};
            }
            assert(chainstate->m_chain.Tip() != nullptr);
        }
    }

    if (!options.wipe_block_tree_db) {
        auto chainstates{chainman.GetAll()};
        if (std::any_of(chainstates.begin(), chainstates.end(),
                        [](const Chainstate* cs) EXCLUSIVE_LOCKS_REQUIRED(cs_main) { return cs->NeedsRedownload(); })) {
            return {ChainstateLoadStatus::FAILURE, strprintf(_("Witness data for blocks after height %d requires validation. Please restart with -reindex."),
                                                             chainman.GetConsensus().SegwitHeight)};
        };
    }

    // Now that chainstates are loaded and we're able to flush to
    // disk, rebalance the coins caches to desired levels based
    // on the condition of each chainstate.
    chainman.MaybeRebalanceCaches();

    return {ChainstateLoadStatus::SUCCESS, {}};
}